

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O0

void __thiscall SNMPPacket::setRequestID(SNMPPacket *this,snmp_request_id_t RequestId)

{
  shared_ptr<IntegerType> local_28;
  snmp_request_id_t local_18;
  snmp_request_id_t RequestId_local;
  SNMPPacket *this_local;
  
  local_18 = RequestId;
  RequestId_local = (snmp_request_id_t)this;
  std::shared_ptr<IntegerType>::shared_ptr(&local_28,(nullptr_t)0x0);
  std::shared_ptr<IntegerType>::operator=(&this->requestIDPtr,&local_28);
  std::shared_ptr<IntegerType>::~shared_ptr(&local_28);
  this->requestID = local_18;
  return;
}

Assistant:

void SNMPPacket::setRequestID(snmp_request_id_t RequestId){
    this->requestIDPtr = nullptr;
    this->requestID = RequestId;
}